

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O0

QString * __thiscall QUrl::toString(QUrl *this,FormattingOptions options)

{
  QFlags<QUrl::ComponentFormattingOption> mask;
  QFlags<QUrl::ComponentFormattingOption> mask_00;
  QChar c;
  QChar c_00;
  QLatin1StringView s;
  QLatin1StringView s_00;
  QChar c_01;
  bool bVar1;
  undefined1 uVar2;
  Section SVar3;
  undefined1 uVar4;
  int iVar5;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> QVar6;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> QVar7;
  int in_EDX;
  long *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<QString_&,_char16_t> QVar8;
  bool pathIsAbsolute;
  QString *url;
  undefined4 in_stack_fffffffffffffe68;
  ComponentFormattingOption in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe74;
  undefined1 in_stack_fffffffffffffe75;
  undefined1 in_stack_fffffffffffffe76;
  undefined1 uVar9;
  undefined1 in_stack_fffffffffffffe77;
  undefined4 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7c;
  undefined1 in_stack_fffffffffffffe7d;
  undefined1 in_stack_fffffffffffffe7e;
  undefined1 in_stack_fffffffffffffe7f;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  undefined4 uVar10;
  undefined4 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8c;
  undefined1 in_stack_fffffffffffffe8d;
  undefined1 in_stack_fffffffffffffe8e;
  undefined1 in_stack_fffffffffffffe8f;
  undefined1 uVar11;
  QStringBuilder<QString_&,_char16_t> *in_stack_fffffffffffffe98;
  FormattingOptions options_00;
  undefined5 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea5;
  char16_t in_stack_fffffffffffffea6;
  QUrlPrivate *in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb1;
  undefined1 in_stack_fffffffffffffeb2;
  bool bVar12;
  undefined1 in_stack_fffffffffffffeb3;
  undefined4 in_stack_fffffffffffffeb4;
  undefined8 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  undefined1 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed1;
  undefined1 in_stack_fffffffffffffed2;
  undefined1 in_stack_fffffffffffffed3;
  undefined1 in_stack_fffffffffffffed4;
  undefined1 in_stack_fffffffffffffed5;
  undefined1 in_stack_fffffffffffffed6;
  undefined1 in_stack_ffffffffffffff00 [16];
  FormattingOptions FVar13;
  QFlagsStorage<QUrl::ComponentFormattingOption> in_stack_ffffffffffffff2c;
  long *plVar14;
  FormattingOptions options_01;
  QChar local_9e;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_9c;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_88;
  int local_84;
  int local_80;
  QChar local_7a;
  QUrlPrivate *local_78;
  char16_t local_70;
  undefined2 local_62;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_60;
  int local_5c [7];
  QMessageLogger local_40;
  int local_20;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_1c;
  QUrlPrivate *local_18;
  char16_t local_10;
  long local_8;
  
  SVar3 = (Section)((ulong)in_stack_fffffffffffffec0 >> 0x38);
  FVar13.i = in_stack_ffffffffffffff00._12_4_;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  plVar14 = in_RSI;
  local_1c.i = in_EDX;
  QString::QString((QString *)0x2fd588);
  options_01.i = (int)((ulong)plVar14 >> 0x20);
  bVar1 = isValid((QUrl *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  if (bVar1) {
    local_20 = (int)QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::
                    operator&((QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>
                               *)CONCAT17(in_stack_fffffffffffffe77,
                                          CONCAT16(in_stack_fffffffffffffe76,
                                                   CONCAT15(in_stack_fffffffffffffe75,
                                                            CONCAT14(in_stack_fffffffffffffe74,
                                                                     in_stack_fffffffffffffe70)))),
                              in_stack_fffffffffffffe6c);
    iVar5 = QUrlTwoFlags::operator_cast_to_int((QUrlTwoFlags *)&local_20);
    if (iVar5 == 0x7f00000) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 (char *)CONCAT17(in_stack_fffffffffffffe7f,
                                  CONCAT16(in_stack_fffffffffffffe7e,
                                           CONCAT15(in_stack_fffffffffffffe7d,
                                                    CONCAT14(in_stack_fffffffffffffe7c,
                                                             in_stack_fffffffffffffe78)))),
                 CONCAT13(in_stack_fffffffffffffe77,
                          CONCAT12(in_stack_fffffffffffffe76,
                                   CONCAT11(in_stack_fffffffffffffe75,in_stack_fffffffffffffe74))),
                 (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      QMessageLogger::warning
                (&local_40,
                 "QUrl: QUrl::FullyDecoded is not permitted when reconstructing the full URL");
      in_stack_ffffffffffffff2c.i =
           (Int)::operator~(CONCAT13(in_stack_fffffffffffffe77,
                                     CONCAT12(in_stack_fffffffffffffe76,
                                              CONCAT11(in_stack_fffffffffffffe75,
                                                       in_stack_fffffffffffffe74))));
      mask.super_QFlagsStorageHelper<QUrl::ComponentFormattingOption,_4>.
      super_QFlagsStorage<QUrl::ComponentFormattingOption>.i._1_1_ = in_stack_fffffffffffffe7d;
      mask.super_QFlagsStorageHelper<QUrl::ComponentFormattingOption,_4>.
      super_QFlagsStorage<QUrl::ComponentFormattingOption>.i._0_1_ = in_stack_fffffffffffffe7c;
      mask.super_QFlagsStorageHelper<QUrl::ComponentFormattingOption,_4>.
      super_QFlagsStorage<QUrl::ComponentFormattingOption>.i._2_1_ = in_stack_fffffffffffffe7e;
      mask.super_QFlagsStorageHelper<QUrl::ComponentFormattingOption,_4>.
      super_QFlagsStorage<QUrl::ComponentFormattingOption>.i._3_1_ = in_stack_fffffffffffffe7f;
      QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::operator&=
                ((QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> *)
                 CONCAT17(in_stack_fffffffffffffe77,
                          CONCAT16(in_stack_fffffffffffffe76,
                                   CONCAT15(in_stack_fffffffffffffe75,
                                            CONCAT14(in_stack_fffffffffffffe74,
                                                     in_stack_fffffffffffffe70)))),mask);
    }
    uVar2 = QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::testFlag
                      (&local_1c,PreferLocalFile);
    if ((((!(bool)uVar2) ||
         (in_stack_fffffffffffffed6 =
               QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::testFlag
                         (&local_1c,RemovePath), (bool)in_stack_fffffffffffffed6)) ||
        ((in_stack_fffffffffffffed5 = QUrlPrivate::hasQuery((QUrlPrivate *)*in_RSI),
         (bool)in_stack_fffffffffffffed5 &&
         (in_stack_fffffffffffffed4 =
               QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::testFlag
                         (&local_1c,RemoveQuery), !(bool)in_stack_fffffffffffffed4)))) ||
       (((in_stack_fffffffffffffed3 = QUrlPrivate::hasFragment((QUrlPrivate *)*in_RSI),
         (bool)in_stack_fffffffffffffed3 &&
         (in_stack_fffffffffffffed2 =
               QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::testFlag
                         (&local_1c,RemoveFragment), !(bool)in_stack_fffffffffffffed2)) ||
        (in_stack_fffffffffffffed1 =
              isLocalFile((QUrl *)CONCAT17(in_stack_fffffffffffffe77,
                                           CONCAT16(in_stack_fffffffffffffe76,
                                                    CONCAT15(in_stack_fffffffffffffe75,
                                                             CONCAT14(in_stack_fffffffffffffe74,
                                                                      in_stack_fffffffffffffe70)))))
        , !(bool)in_stack_fffffffffffffed1)))) {
      local_5c[0] = (int)QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::
                         operator&((QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>
                                    *)CONCAT17(in_stack_fffffffffffffe77,
                                               CONCAT16(in_stack_fffffffffffffe76,
                                                        CONCAT15(in_stack_fffffffffffffe75,
                                                                 CONCAT14(in_stack_fffffffffffffe74,
                                                                          in_stack_fffffffffffffe70)
                                                                ))),in_stack_fffffffffffffe6c);
      iVar5 = QUrlTwoFlags::operator_cast_to_int((QUrlTwoFlags *)local_5c);
      if (iVar5 == 0) {
        QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::operator|=
                  (&local_1c,EncodeReserved);
      }
      else {
        ::operator~(CONCAT13(in_stack_fffffffffffffe77,
                             CONCAT12(in_stack_fffffffffffffe76,
                                      CONCAT11(in_stack_fffffffffffffe75,in_stack_fffffffffffffe74))
                            ));
        mask_00.super_QFlagsStorageHelper<QUrl::ComponentFormattingOption,_4>.
        super_QFlagsStorage<QUrl::ComponentFormattingOption>.i._1_1_ = in_stack_fffffffffffffe7d;
        mask_00.super_QFlagsStorageHelper<QUrl::ComponentFormattingOption,_4>.
        super_QFlagsStorage<QUrl::ComponentFormattingOption>.i._0_1_ = in_stack_fffffffffffffe7c;
        mask_00.super_QFlagsStorageHelper<QUrl::ComponentFormattingOption,_4>.
        super_QFlagsStorage<QUrl::ComponentFormattingOption>.i._2_1_ = in_stack_fffffffffffffe7e;
        mask_00.super_QFlagsStorageHelper<QUrl::ComponentFormattingOption,_4>.
        super_QFlagsStorage<QUrl::ComponentFormattingOption>.i._3_1_ = in_stack_fffffffffffffe7f;
        QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::operator&=
                  ((QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> *)
                   CONCAT17(in_stack_fffffffffffffe77,
                            CONCAT16(in_stack_fffffffffffffe76,
                                     CONCAT15(in_stack_fffffffffffffe75,
                                              CONCAT14(in_stack_fffffffffffffe74,
                                                       in_stack_fffffffffffffe70)))),mask_00);
      }
      local_60 = QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::operator&
                           ((QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>
                             *)CONCAT17(in_stack_fffffffffffffe77,
                                        CONCAT16(in_stack_fffffffffffffe76,
                                                 CONCAT15(in_stack_fffffffffffffe75,
                                                          CONCAT14(in_stack_fffffffffffffe74,
                                                                   in_stack_fffffffffffffe70)))),
                            in_stack_fffffffffffffe6c);
      bVar1 = QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::operator!
                        (&local_60);
      bVar12 = false;
      if (bVar1) {
        bVar12 = QUrlPrivate::hasScheme((QUrlPrivate *)*in_RSI);
      }
      if (bVar12 != false) {
        local_62 = 0x3a;
        QVar8 = ::operator+((QString *)
                            CONCAT17(in_stack_fffffffffffffe7f,
                                     CONCAT16(in_stack_fffffffffffffe7e,
                                              CONCAT15(in_stack_fffffffffffffe7d,
                                                       CONCAT14(in_stack_fffffffffffffe7c,
                                                                in_stack_fffffffffffffe78)))),
                            (char16_t *)
                            CONCAT17(in_stack_fffffffffffffe77,
                                     CONCAT16(in_stack_fffffffffffffe76,
                                              CONCAT15(in_stack_fffffffffffffe75,
                                                       CONCAT14(in_stack_fffffffffffffe74,
                                                                in_stack_fffffffffffffe70)))));
        in_stack_fffffffffffffea8 = (QUrlPrivate *)QVar8.a;
        in_stack_fffffffffffffea6 = QVar8.b;
        local_78 = in_stack_fffffffffffffea8;
        local_70 = in_stack_fffffffffffffea6;
        local_18 = in_stack_fffffffffffffea8;
        local_10 = in_stack_fffffffffffffea6;
        ::operator+=((QString *)
                     CONCAT26(in_stack_fffffffffffffea6,
                              CONCAT15(in_stack_fffffffffffffea5,in_stack_fffffffffffffea0)),
                     in_stack_fffffffffffffe98);
      }
      options_00.i = (int)((ulong)(*in_RSI + 0x68) >> 0x20);
      QChar::QChar<char16_t,_true>(&local_7a,L'/');
      c_01.ucs._1_1_ = in_stack_fffffffffffffe8f;
      c_01.ucs._0_1_ = in_stack_fffffffffffffe8e;
      bVar1 = QString::startsWith((QString *)
                                  CONCAT17(in_stack_fffffffffffffe7f,
                                           CONCAT16(in_stack_fffffffffffffe7e,
                                                    CONCAT15(in_stack_fffffffffffffe7d,
                                                             CONCAT14(in_stack_fffffffffffffe7c,
                                                                      in_stack_fffffffffffffe78)))),
                                  c_01,CONCAT13(in_stack_fffffffffffffe77,
                                                CONCAT12(in_stack_fffffffffffffe76,
                                                         CONCAT11(in_stack_fffffffffffffe75,
                                                                  in_stack_fffffffffffffe74))));
      uVar9 = bVar1;
      local_80 = (int)QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::
                      operator&((QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>
                                 *)CONCAT17(in_stack_fffffffffffffe77,
                                            CONCAT16(in_stack_fffffffffffffe76,
                                                     CONCAT15(in_stack_fffffffffffffe75,
                                                              CONCAT14(in_stack_fffffffffffffe74,
                                                                       in_stack_fffffffffffffe70))))
                                ,in_stack_fffffffffffffe6c);
      iVar5 = QUrlTwoFlags::operator_cast_to_int((QUrlTwoFlags *)&local_80);
      uVar11 = false;
      if (iVar5 != 0x1e) {
        in_stack_fffffffffffffe8e = QUrlPrivate::hasAuthority((QUrlPrivate *)*in_RSI);
        uVar11 = in_stack_fffffffffffffe8e;
      }
      if ((bool)uVar11 == false) {
        in_stack_fffffffffffffe8d =
             isLocalFile((QUrl *)CONCAT17(in_stack_fffffffffffffe77,
                                          CONCAT16(in_stack_fffffffffffffe76,
                                                   CONCAT15(in_stack_fffffffffffffe75,
                                                            CONCAT14(in_stack_fffffffffffffe74,
                                                                     in_stack_fffffffffffffe70)))));
        FVar13.i = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
        if (((bool)in_stack_fffffffffffffe8d) && (bVar1)) {
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)CONCAT17(in_stack_fffffffffffffe7f,
                                      CONCAT16(in_stack_fffffffffffffe7e,
                                               CONCAT15(in_stack_fffffffffffffe7d,
                                                        CONCAT14(in_stack_fffffffffffffe7c,
                                                                 in_stack_fffffffffffffe78)))),
                     CONCAT17(in_stack_fffffffffffffe77,
                              CONCAT16(in_stack_fffffffffffffe76,
                                       CONCAT15(in_stack_fffffffffffffe75,
                                                CONCAT14(in_stack_fffffffffffffe74,
                                                         in_stack_fffffffffffffe70)))));
          s_00.m_size._4_4_ = in_stack_fffffffffffffe84;
          s_00.m_size._0_4_ = in_stack_fffffffffffffe80;
          s_00.m_data._0_4_ = in_stack_fffffffffffffe88;
          s_00.m_data._4_1_ = in_stack_fffffffffffffe8c;
          s_00.m_data._5_1_ = in_stack_fffffffffffffe8d;
          s_00.m_data._6_1_ = in_stack_fffffffffffffe8e;
          s_00.m_data._7_1_ = uVar11;
          QString::operator+=((QString *)
                              CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),s_00);
        }
      }
      else {
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)CONCAT17(in_stack_fffffffffffffe7f,
                                    CONCAT16(in_stack_fffffffffffffe7e,
                                             CONCAT15(in_stack_fffffffffffffe7d,
                                                      CONCAT14(in_stack_fffffffffffffe7c,
                                                               in_stack_fffffffffffffe78)))),
                   CONCAT17(in_stack_fffffffffffffe77,
                            CONCAT16(in_stack_fffffffffffffe76,
                                     CONCAT15(in_stack_fffffffffffffe75,
                                              CONCAT14(in_stack_fffffffffffffe74,
                                                       in_stack_fffffffffffffe70)))));
        s.m_size._4_4_ = in_stack_fffffffffffffe84;
        s.m_size._0_4_ = in_stack_fffffffffffffe80;
        s.m_data._0_4_ = in_stack_fffffffffffffe88;
        s.m_data._4_1_ = in_stack_fffffffffffffe8c;
        s.m_data._5_1_ = in_stack_fffffffffffffe8d;
        s.m_data._6_1_ = in_stack_fffffffffffffe8e;
        s.m_data._7_1_ = uVar11;
        QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)
                            ,s);
        local_84 = local_1c.i;
        QUrlPrivate::appendAuthority
                  (in_stack_fffffffffffffea8,
                   (QString *)
                   CONCAT26(in_stack_fffffffffffffea6,CONCAT15(uVar9,in_stack_fffffffffffffea0)),
                   FVar13,(Section)((uint)options_00.i >> 0x18));
        FVar13.i = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
      }
      QVar6 = QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::operator&
                        ((QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> *
                         )CONCAT17(in_stack_fffffffffffffe77,
                                   CONCAT16(in_stack_fffffffffffffe76,
                                            CONCAT15(in_stack_fffffffffffffe75,
                                                     CONCAT14(in_stack_fffffffffffffe74,
                                                              in_stack_fffffffffffffe70)))),
                         in_stack_fffffffffffffe6c);
      local_88 = QVar6;
      bVar1 = QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::operator!
                        (&local_88);
      uVar10 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe84);
      if (bVar1) {
        QUrlPrivate::appendPath
                  ((QUrlPrivate *)
                   CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffed6,
                                           CONCAT15(in_stack_fffffffffffffed5,
                                                    CONCAT14(in_stack_fffffffffffffed4,
                                                             CONCAT13(in_stack_fffffffffffffed3,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffffed2,
                                                  CONCAT11(in_stack_fffffffffffffed1,
                                                           in_stack_fffffffffffffed0))))))),
                   (QString *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                   options_01,SVar3);
      }
      QVar7 = QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::operator&
                        ((QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> *
                         )CONCAT17(in_stack_fffffffffffffe77,
                                   CONCAT16(in_stack_fffffffffffffe76,
                                            CONCAT15(in_stack_fffffffffffffe75,
                                                     CONCAT14(in_stack_fffffffffffffe74,
                                                              in_stack_fffffffffffffe70)))),
                         in_stack_fffffffffffffe6c);
      SVar3 = QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::operator!
                        ((QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> *
                         )&stack0xffffffffffffff70);
      uVar2 = false;
      if ((bool)SVar3) {
        in_stack_fffffffffffffe7d = QUrlPrivate::hasQuery((QUrlPrivate *)*in_RSI);
        uVar2 = in_stack_fffffffffffffe7d;
      }
      if ((bool)uVar2 != false) {
        QChar::QChar<char16_t,_true>((QChar *)&stack0xffffffffffffff6e,L'?');
        c.ucs._1_1_ = SVar3;
        c.ucs._0_1_ = uVar2;
        QString::operator+=((QString *)
                            CONCAT17(in_stack_fffffffffffffe77,
                                     CONCAT16(in_stack_fffffffffffffe76,
                                              CONCAT15(in_stack_fffffffffffffe75,
                                                       CONCAT14(in_stack_fffffffffffffe74,
                                                                in_stack_fffffffffffffe70)))),c);
        QUrlPrivate::appendQuery
                  ((QUrlPrivate *)
                   CONCAT17(SVar3,CONCAT16(uVar2,CONCAT15(in_stack_fffffffffffffe7d,
                                                          CONCAT14(in_stack_fffffffffffffe7c,
                                                                   in_stack_fffffffffffffe78)))),
                   (QString *)
                   CONCAT17(in_stack_fffffffffffffe77,
                            CONCAT16(in_stack_fffffffffffffe76,
                                     CONCAT15(in_stack_fffffffffffffe75,
                                              CONCAT14(in_stack_fffffffffffffe74,
                                                       in_stack_fffffffffffffe70)))),options_00,
                   (Section)(in_stack_fffffffffffffe6c >> 0x18));
      }
      local_9c = QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::operator&
                           ((QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>
                             *)CONCAT17(in_stack_fffffffffffffe77,
                                        CONCAT16(in_stack_fffffffffffffe76,
                                                 CONCAT15(in_stack_fffffffffffffe75,
                                                          CONCAT14(in_stack_fffffffffffffe74,
                                                                   in_stack_fffffffffffffe70)))),
                            in_stack_fffffffffffffe6c);
      uVar4 = QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::operator!
                        (&local_9c);
      uVar9 = false;
      if ((bool)uVar4) {
        in_stack_fffffffffffffe75 = QUrlPrivate::hasFragment((QUrlPrivate *)*in_RSI);
        uVar9 = in_stack_fffffffffffffe75;
      }
      if ((bool)uVar9 != false) {
        QChar::QChar<char16_t,_true>(&local_9e,L'#');
        c_00.ucs._1_1_ = SVar3;
        c_00.ucs._0_1_ = uVar2;
        QString::operator+=((QString *)
                            CONCAT17(uVar4,CONCAT16(uVar9,CONCAT15(in_stack_fffffffffffffe75,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffffe74,
                                                  in_stack_fffffffffffffe70)))),c_00);
        QUrlPrivate::appendFragment
                  ((QUrlPrivate *)
                   CONCAT17(uVar11,CONCAT16(in_stack_fffffffffffffe8e,
                                            CONCAT15(in_stack_fffffffffffffe8d,
                                                     CONCAT14(in_stack_fffffffffffffe8c,QVar6.i)))),
                   (QString *)CONCAT44(uVar10,QVar7.i),FVar13,SVar3);
      }
    }
    else {
      QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::operator|
                ((QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> *)
                 CONCAT17(in_stack_fffffffffffffe77,
                          CONCAT16(in_stack_fffffffffffffe76,
                                   CONCAT15(in_stack_fffffffffffffe75,
                                            CONCAT14(in_stack_fffffffffffffe74,
                                                     in_stack_fffffffffffffe70)))),
                 in_stack_fffffffffffffe6c);
      QUrlPrivate::toLocalFile
                ((QUrlPrivate *)
                 CONCAT44(in_stack_fffffffffffffeb4,
                          CONCAT13(in_stack_fffffffffffffeb3,
                                   CONCAT12(in_stack_fffffffffffffeb2,
                                            CONCAT11(in_stack_fffffffffffffeb1,
                                                     in_stack_fffffffffffffeb0)))),
                 (FormattingOptions)in_stack_ffffffffffffff2c.i);
      QString::operator=((QString *)
                         CONCAT17(in_stack_fffffffffffffe77,
                                  CONCAT16(in_stack_fffffffffffffe76,
                                           CONCAT15(in_stack_fffffffffffffe75,
                                                    CONCAT14(in_stack_fffffffffffffe74,
                                                             in_stack_fffffffffffffe70)))),
                         (QString *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      QString::~QString((QString *)0x2fd7e4);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QUrl::toString(FormattingOptions options) const
{
    QString url;
    if (!isValid()) {
        // also catches isEmpty()
        return url;
    }
    if ((options & QUrl::FullyDecoded) == QUrl::FullyDecoded) {
        qWarning("QUrl: QUrl::FullyDecoded is not permitted when reconstructing the full URL");
        options &= ~QUrl::FullyDecoded;
        //options |= QUrl::PrettyDecoded; // no-op, value is 0
    }

    // return just the path if:
    //  - QUrl::PreferLocalFile is passed
    //  - QUrl::RemovePath isn't passed (rather stupid if the user did...)
    //  - there's no query or fragment to return
    //    that is, either they aren't present, or we're removing them
    //  - it's a local file
    if (options.testFlag(QUrl::PreferLocalFile) && !options.testFlag(QUrl::RemovePath)
            && (!d->hasQuery() || options.testFlag(QUrl::RemoveQuery))
            && (!d->hasFragment() || options.testFlag(QUrl::RemoveFragment))
            && isLocalFile()) {
        url = d->toLocalFile(options | QUrl::FullyDecoded);
        return url;
    }

    // for the full URL, we consider that the reserved characters are prettier if encoded
    if (options & DecodeReserved)
        options &= ~EncodeReserved;
    else
        options |= EncodeReserved;

    if (!(options & QUrl::RemoveScheme) && d->hasScheme())
        url += d->scheme + u':';

    bool pathIsAbsolute = d->path.startsWith(u'/');
    if (!((options & QUrl::RemoveAuthority) == QUrl::RemoveAuthority) && d->hasAuthority()) {
        url += "//"_L1;
        d->appendAuthority(url, options, QUrlPrivate::FullUrl);
    } else if (isLocalFile() && pathIsAbsolute) {
        // Comply with the XDG file URI spec, which requires triple slashes.
        url += "//"_L1;
    }

    if (!(options & QUrl::RemovePath))
        d->appendPath(url, options, QUrlPrivate::FullUrl);

    if (!(options & QUrl::RemoveQuery) && d->hasQuery()) {
        url += u'?';
        d->appendQuery(url, options, QUrlPrivate::FullUrl);
    }
    if (!(options & QUrl::RemoveFragment) && d->hasFragment()) {
        url += u'#';
        d->appendFragment(url, options, QUrlPrivate::FullUrl);
    }

    return url;
}